

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ForkBranch<kj::Own<CallResultHolder>_>_> __thiscall
kj::
heap<kj::_::ForkBranch<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>,kj::Own<kj::_::ForkHub<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>>>
          (kj *this,Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *params)

{
  ForkBranch<kj::Own<CallResultHolder>_> *this_00;
  Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *other;
  ForkBranch<kj::Own<CallResultHolder>_> *extraout_RDX;
  Own<kj::_::ForkBranch<kj::Own<CallResultHolder>_>_> OVar1;
  Own<kj::_::ForkHubBase> local_28;
  NoInfer<kj::Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_>_> *local_18;
  Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *params_local;
  
  local_18 = params;
  params_local = (Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *)this;
  this_00 = (ForkBranch<kj::Own<CallResultHolder>_> *)operator_new(0x30);
  other = fwd<kj::Own<kj::_::ForkHub<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>>>
                    (local_18);
  Own<kj::_::ForkHubBase>::
  Own<kj::_::ForkHub<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>,void>
            (&local_28,other);
  _::ForkBranch<kj::Own<CallResultHolder>_>::ForkBranch(this_00,&local_28);
  Own<kj::_::ForkBranch<kj::Own<CallResultHolder>_>_>::Own
            ((Own<kj::_::ForkBranch<kj::Own<CallResultHolder>_>_> *)this,this_00,
             (Disposer *)
             &_::
              HeapDisposer<kj::_::ForkBranch<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>>
              ::instance);
  Own<kj::_::ForkHubBase>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}